

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O1

void Gia_ManWriteNames(FILE *pFile,char c,int n,Vec_Ptr_t *vNames,int Start,int Skip,
                      Vec_Bit_t *vObjs)

{
  bool bVar1;
  char *pcVar2;
  uint uVar3;
  size_t sVar4;
  int d;
  
  d = n;
  if (1 < (uint)n) {
    d = 0;
    uVar3 = n - 1;
    if (uVar3 != 0) {
      do {
        d = d + 1;
        bVar1 = 9 < uVar3;
        uVar3 = uVar3 / 10;
      } while (bVar1);
    }
  }
  if (0 < n) {
    uVar3 = 0;
    bVar1 = true;
    do {
      if (vObjs == (Vec_Bit_t *)0x0) {
LAB_0021b88c:
        Gia_ObjGetDumpName(vNames,c,uVar3,d);
        sVar4 = strlen(Gia_ObjGetDumpName::pBuffer);
        Start = Start + (int)sVar4 + 2;
        if (0x3c < Start) {
          fwrite(",\n    ",6,1,(FILE *)pFile);
          bVar1 = true;
          Start = Skip;
        }
        pcVar2 = "T = %d\t\t";
        if (!bVar1) {
          pcVar2 = "    \"%s\", ";
        }
        bVar1 = false;
        fprintf((FILE *)pFile,"%s%s",pcVar2 + 8,Gia_ObjGetDumpName::pBuffer);
      }
      else {
        if (vObjs->nSize <= (int)uVar3) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                        ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
        }
        if (((uint)vObjs->pArray[uVar3 >> 5] >> (uVar3 & 0x1f) & 1) != 0) goto LAB_0021b88c;
      }
      uVar3 = uVar3 + 1;
    } while (n != uVar3);
  }
  return;
}

Assistant:

void Gia_ManWriteNames( FILE * pFile, char c, int n, Vec_Ptr_t * vNames, int Start, int Skip, Vec_Bit_t * vObjs )
{
    int Digits = Abc_Base10Log( n );
    int Length = Start, i, fFirst = 1; 
    char * pName;
    for ( i = 0; i < n; i++ )
    {
        if ( vObjs && !Vec_BitEntry(vObjs, i) )
            continue;
        pName = Gia_ObjGetDumpName( vNames, c, i, Digits );
        Length += strlen(pName) + 2;
        if ( Length > 60 )
        {
            fprintf( pFile, ",\n    " );
            Length = Skip;
            fFirst = 1;
        }
        fprintf( pFile, "%s%s", fFirst ? "":", ", pName );
        fFirst = 0;
    }
}